

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::ArrayElementRef::isSliceRangeValid(ArrayElementRef *this)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  int64_t start;
  ArraySize end;
  pool_ptr<soul::AST::Expression> *this_00;
  Type type;
  Type local_48;
  pool_ptr<soul::AST::Expression> local_30;
  pool_ptr<soul::AST::Expression> local_28;
  pool_ptr<soul::AST::Expression> local_20;
  
  if (this->isSlice == true) {
    local_20.object = (this->object).object;
    bVar1 = isResolvedAsValue(&local_20);
    if (bVar1) {
      local_28.object = (this->startIndex).object;
      bVar1 = isResolvedAsValue(&local_28);
      if (bVar1) {
        pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&this->startIndex);
        (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_48,pEVar3);
        if (CONCAT71(local_48._1_7_,local_48.category) != 0) {
          pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&local_48);
          start = soul::Value::getAsInt64(&pCVar4->value);
          if ((this->endIndex).object == (Expression *)0x0) {
            pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
            (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48,pEVar3);
            end = Type::getArrayOrVectorSize(&local_48);
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
LAB_00209053:
            pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
            (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48,pEVar3);
            if ((local_48.category & ~primitive) == vector) {
              bVar1 = Type::isValidArrayOrVectorRange<long>(&local_48,start,end);
            }
            else {
              bVar1 = false;
            }
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
            return bVar1;
          }
          this_00 = &this->endIndex;
          pEVar3 = pool_ptr<soul::AST::Expression>::operator->(this_00);
          iVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar3);
          if ((char)iVar2 != '\0') {
            local_30.object = this_00->object;
            bVar1 = isResolvedAsValue(&local_30);
            if (!bVar1) {
              throwInternalCompilerError("isResolvedAsValue (endIndex)","isSliceRangeValid",0x9c9);
            }
            pEVar3 = pool_ptr<soul::AST::Expression>::operator->(this_00);
            (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_48,pEVar3);
            if (CONCAT71(local_48._1_7_,local_48.category) != 0) {
              pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                                 ((pool_ptr<soul::AST::Constant> *)&local_48);
              end = soul::Value::getAsInt64(&pCVar4->value);
              goto LAB_00209053;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool isSliceRangeValid() const
        {
            if (isSlice && isResolvedAsValue (object) && isResolvedAsValue (startIndex))
            {
                int64_t start = 0, end = 0;

                if (auto c = startIndex->getAsConstant())
                    start = c->value.getAsInt64();
                else
                    return false;

                if (endIndex == nullptr)
                {
                    end = (int64_t) object->getResultType().getArrayOrVectorSize();
                }
                else
                {
                    if (! endIndex->isResolved())
                        return false;

                    SOUL_ASSERT (isResolvedAsValue (endIndex));

                    if (auto c = endIndex->getAsConstant())
                        end = c->value.getAsInt64();
                    else
                        return false;
                }

                auto type = object->getResultType();
                return type.isArrayOrVector() && type.isValidArrayOrVectorRange (start, end);
            }

            return false;
        }